

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix3.hpp
# Opt level: O0

SquareMatrix3<double> * OpenMD::outProduct<double>(Vector3<double> *v1,Vector3<double> *v2)

{
  double dVar1;
  double dVar2;
  double *pdVar3;
  Vector<double,_3U> *in_RDX;
  Vector<double,_3U> *in_RSI;
  RectMatrix<double,_3U,_3U> *in_RDI;
  uint j;
  uint i;
  SquareMatrix3<double> *result;
  undefined4 local_24;
  undefined4 local_20;
  
  SquareMatrix3<double>::SquareMatrix3((SquareMatrix3<double> *)0x13573a);
  for (local_20 = 0; local_20 < 3; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      pdVar3 = Vector<double,_3U>::operator[](in_RSI,local_20);
      dVar1 = *pdVar3;
      pdVar3 = Vector<double,_3U>::operator[](in_RDX,local_24);
      dVar2 = *pdVar3;
      pdVar3 = RectMatrix<double,_3U,_3U>::operator()(in_RDI,local_20,local_24);
      *pdVar3 = dVar1 * dVar2;
    }
  }
  return (SquareMatrix3<double> *)in_RDI;
}

Assistant:

inline SquareMatrix3<Real> outProduct(const Vector3<Real>& v1,
                                        const Vector3<Real>& v2) {
    SquareMatrix3<Real> result;

    for (unsigned int i = 0; i < 3; i++) {
      for (unsigned int j = 0; j < 3; j++) {
        result(i, j) = v1[i] * v2[j];
      }
    }

    return result;
  }